

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineInputFile::rawPixelData
          (DeepScanLineInputFile *this,int firstScanLine,char *pixelData,Int64 *pixelDataSize)

{
  long *plVar1;
  ulong uVar2;
  bool bVar3;
  reference pvVar4;
  ostream *poVar5;
  InputExc *pIVar6;
  value_type vVar7;
  ArgExc *this_00;
  ulong uVar8;
  ulong *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  bool big_enough;
  Int64 totalSizeRequired;
  Int64 packedDataSize;
  Int64 sampleCountTableSize;
  stringstream _iex_throw_s_1;
  int partNumber;
  int yInFile;
  Lock lock;
  stringstream _iex_throw_s;
  Int64 lineOffset;
  int lineBufferNumber;
  int minY;
  unsigned_long *in_stack_fffffffffffffc08;
  undefined6 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc16;
  undefined1 in_stack_fffffffffffffc17;
  Mutex *in_stack_fffffffffffffc18;
  Lock *in_stack_fffffffffffffc20;
  int local_378;
  undefined4 uStack_374;
  int local_370;
  undefined4 uStack_36c;
  stringstream local_368 [16];
  ostream local_358 [376];
  int local_1e0;
  int local_1dc;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  value_type local_30;
  int local_28;
  int local_24;
  ulong *local_20;
  int *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_24 = lineBufferMinY(in_ESI,*(int *)(*(long *)(in_RDI + 8) + 0xdc),
                            *(int *)(*(long *)(in_RDI + 8) + 0x168));
  local_28 = (local_24 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) /
             *(int *)(*(long *)(in_RDI + 8) + 0x168);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      (*(long *)(in_RDI + 8) + 0xe8),(long)local_28);
  local_30 = *pvVar4;
  if (local_30 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar5 = std::operator<<(local_1a8,"Scan line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_24);
    std::operator<<(poVar5," is missing.");
    pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar6,local_1b8);
    __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,(bool)in_stack_fffffffffffffc17);
  vVar7 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28) + 0x28))();
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      (*(long *)(in_RDI + 8) + 0xe8),(long)local_28);
  if (vVar7 != *pvVar4) {
    plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28);
    (**(code **)(*plVar1 + 0x30))(plVar1,local_30);
  }
  bVar3 = isMultiPart(*(int *)(*(long *)(in_RDI + 8) + 0x60));
  if ((bVar3) &&
     (Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)),
                 (int *)in_stack_fffffffffffffc08),
     local_1e0 != *(int *)(*(long *)(in_RDI + 8) + 0x16c))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_368);
    poVar5 = std::operator<<(local_358,"Unexpected part number ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1e0);
    poVar5 = std::operator<<(poVar5,", should be ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)(*(long *)(in_RDI + 8) + 0x16c));
    std::operator<<(poVar5,".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_368);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            ((IStream *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)),
             (int *)in_stack_fffffffffffffc08);
  if (local_1dc == local_24) {
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              ((IStream *)
               CONCAT17(in_stack_fffffffffffffc17,
                        CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)),
               in_stack_fffffffffffffc08);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              ((IStream *)
               CONCAT17(in_stack_fffffffffffffc17,
                        CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)),
               in_stack_fffffffffffffc08);
    uVar8 = CONCAT44(uStack_36c,local_370) + 0x1c + CONCAT44(uStack_374,local_378);
    uVar2 = *local_20;
    *local_20 = uVar8;
    if ((uVar2 < uVar8) || (local_18 == (int *)0x0)) {
      in_stack_fffffffffffffc17 = isMultiPart(*(int *)(*(long *)(in_RDI + 8) + 0x60));
      if ((!(bool)in_stack_fffffffffffffc17) &&
         (*(int *)(*(long *)(in_RDI + 8) + 0x104) == local_24)) {
        plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28);
        (**(code **)(*plVar1 + 0x30))(plVar1,local_30);
      }
    }
    else {
      *local_18 = local_1dc;
      *(ulong *)(local_18 + 1) = CONCAT44(uStack_36c,local_370);
      *(ulong *)(local_18 + 3) = CONCAT44(uStack_374,local_378);
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)),
                 in_stack_fffffffffffffc08);
      plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28);
      (**(code **)(*plVar1 + 0x18))(plVar1,local_18 + 7,local_370 + local_378);
      in_stack_fffffffffffffc16 = isMultiPart(*(int *)(*(long *)(in_RDI + 8) + 0x60));
      if ((!(bool)in_stack_fffffffffffffc16) &&
         (*(int *)(*(long *)(in_RDI + 8) + 0x104) == local_24)) {
        plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28);
        (**(code **)(*plVar1 + 0x30))(plVar1,local_30);
      }
    }
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)));
    return;
  }
  pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar6,"Unexpected data block y coordinate.");
  __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
DeepScanLineInputFile::rawPixelData (int firstScanLine,
                                     char *pixelData,
                                     Int64 &pixelDataSize)
{
   
    
    int minY = lineBufferMinY
    (firstScanLine, _data->minY, _data->linesInBuffer);
    int lineBufferNumber = (minY - _data->minY) / _data->linesInBuffer;
    
    Int64 lineOffset = _data->lineOffsets[lineBufferNumber];
    
    if (lineOffset == 0)
        THROW (IEX_NAMESPACE::InputExc, "Scan line " << minY << " is missing.");
    
    
    // enter the lock here - prevent another thread reseeking the file during read
    Lock lock (*_data->_streamData);
    
    //
    // Seek to the start of the scan line in the file,
    //
    
    if (_data->_streamData->is->tellg() != _data->lineOffsets[lineBufferNumber])
        _data->_streamData->is->seekg (lineOffset);
    
    //
    // Read the data block's header.
    //
    
    int yInFile;
    
    //
    // Read the part number when we are dealing with a multi-part file.
    //
    
    if (isMultiPart(_data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, partNumber);
        if (partNumber != _data->partNumber)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Unexpected part number " << partNumber
            << ", should be " << _data->partNumber << ".");
        }
    }
    
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, yInFile);
    
    if (yInFile != minY)
        throw IEX_NAMESPACE::InputExc ("Unexpected data block y coordinate.");
    
    Int64 sampleCountTableSize;
    Int64 packedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, sampleCountTableSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, packedDataSize);
    
    // total requirement for reading all the data
    
    Int64 totalSizeRequired=28+sampleCountTableSize+packedDataSize;
    
    bool big_enough = totalSizeRequired<=pixelDataSize;
    
    pixelDataSize = totalSizeRequired;
    
    // was the block we were given big enough?
    if(!big_enough || pixelData==NULL)
    {        
        // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
        // in single part files)
        if(!isMultiPart(_data->version))
        {
          if (_data->nextLineBufferMinY == minY)
              _data->_streamData->is->seekg (lineOffset);
        }
        // leave lock here - bail before reading more data
        return;
    }
    
    // copy the values we have read into the output block
    *(int *) pixelData = yInFile;
    *(Int64 *) (pixelData+4) =sampleCountTableSize;
    *(Int64 *) (pixelData+12) = packedDataSize;
    
    // didn't read the unpackedsize - do that now
    Xdr::read<StreamIO> (*_data->_streamData->is, *(Int64 *) (pixelData+20));
    
    // read the actual data
    _data->_streamData->is->read(pixelData+28, sampleCountTableSize+packedDataSize);
    
    // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
    // in single part files)
    if(!isMultiPart(_data->version))
    {
        if (_data->nextLineBufferMinY == minY)
            _data->_streamData->is->seekg (lineOffset);
    }
    
    // leave lock here
    
}